

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFont::GrowIndex(ImFont *this,int new_size)

{
  unsigned_short local_1a;
  float local_18;
  int local_14;
  ImFont *pIStack_10;
  int new_size_local;
  ImFont *this_local;
  
  local_14 = new_size;
  pIStack_10 = this;
  if ((this->IndexAdvanceX).Size != (this->IndexLookup).Size) {
    __assert_fail("IndexAdvanceX.Size == IndexLookup.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui_draw.cpp"
                  ,0xa09,"void ImFont::GrowIndex(int)");
  }
  if ((this->IndexLookup).Size < new_size) {
    local_18 = -1.0;
    ImVector<float>::resize(&this->IndexAdvanceX,new_size,&local_18);
    local_1a = 0xffff;
    ImVector<unsigned_short>::resize(&this->IndexLookup,local_14,&local_1a);
  }
  return;
}

Assistant:

void ImFont::GrowIndex(int new_size)
{
    IM_ASSERT(IndexAdvanceX.Size == IndexLookup.Size);
    if (new_size <= IndexLookup.Size)
        return;
    IndexAdvanceX.resize(new_size, -1.0f);
    IndexLookup.resize(new_size, (ImWchar)-1);
}